

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O1

TIfStackEntry __thiscall tcpp::Preprocessor::_processIfndefConditional(Preprocessor *this)

{
  TMacroDesc *pTVar1;
  _Elt_pointer pTVar2;
  bool bVar3;
  _Elt_pointer pTVar4;
  _Elt_pointer pTVar5;
  uint uVar6;
  long lVar7;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  __it;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  __it_00;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  _Var8;
  string macroIdentifier;
  TToken currToken;
  long *local_c0 [2];
  long local_b0 [2];
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  size_t local_78;
  size_t sStack_70;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  size_t local_40;
  size_t sStack_38;
  
  Lexer::_getNextTokenInternal((TToken *)local_68,this->mpLexer,false);
  local_a0._0_4_ = 0xb;
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  Lexer::_getNextTokenInternal((TToken *)local_a0,this->mpLexer,false);
  local_68._0_4_ = local_a0._0_4_;
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_98);
  local_40 = local_78;
  sStack_38 = sStack_70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  local_a0 = (undefined1  [8])((ulong)local_a0 & 0xffffffff00000000);
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,local_60._M_p,local_60._M_p + local_58);
  do {
    Lexer::_getNextTokenInternal((TToken *)local_a0,this->mpLexer,false);
    local_68._0_4_ = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_98);
    local_40 = local_78;
    sStack_38 = sStack_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
  } while (local_68._0_4_ == SPACE);
  local_a0._0_4_ = NEWLINE;
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  __it._M_current =
       (this->mSymTable).super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->mSymTable).super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = (undefined1  [8])local_c0;
  lVar7 = ((long)pTVar1 - (long)__it._M_current >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  __it_00._M_current = __it._M_current;
  if (0 < lVar7) {
    __it_00._M_current = __it._M_current + lVar7 * 4;
    lVar7 = lVar7 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
              operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)
                         local_a0,__it);
      _Var8._M_current = __it._M_current;
      if (bVar3) goto LAB_0015b419;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
              operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)
                         local_a0,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0015b419;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
              operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)
                         local_a0,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0015b419;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
              operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)
                         local_a0,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0015b419;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pTVar1 - (long)__it_00._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      _Var8._M_current = pTVar1;
      if ((lVar7 != 3) ||
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>
                  ::operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)
                               local_a0,__it_00), _Var8._M_current = __it_00._M_current, bVar3))
      goto LAB_0015b419;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
            operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)local_a0,
                       __it_00);
    _Var8._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0015b419;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::$_0>::
          operator()((_Iter_pred<tcpp::Preprocessor::_processIfndefConditional()::__0> *)local_a0,
                     __it_00);
  _Var8._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var8._M_current = pTVar1;
  }
LAB_0015b419:
  pTVar4 = (this->mConditionalBlocksStack).c.
           super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pTVar4 == (this->mConditionalBlocksStack).c.
                super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar6 = 0x1000000;
  }
  else {
    pTVar2 = (this->mConditionalBlocksStack).c.
             super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pTVar5 = pTVar4;
    if (pTVar4 == pTVar2) {
      pTVar5 = (this->mConditionalBlocksStack).c.
               super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    uVar6 = 0;
    if (pTVar5[-1].mIsParentBlockActive == true) {
      if (pTVar4 == pTVar2) {
        pTVar4 = (this->mConditionalBlocksStack).c.
                 super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      uVar6 = (pTVar4[-1].mShouldBeSkipped ^ 1) << 0x18;
    }
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  return (TIfStackEntry)
         ((uint)(_Var8._M_current != pTVar1) | (uint)(_Var8._M_current == pTVar1) << 0x10 | uVar6);
}

Assistant:

Preprocessor::TIfStackEntry Preprocessor::_processIfndefConditional() TCPP_NOEXCEPT
	{
		auto currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::SPACE, currToken.mType);

		currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::IDENTIFIER, currToken.mType);

		std::string macroIdentifier = currToken.mRawView;

		do {
			currToken = mpLexer->GetNextToken();
		} while (currToken.mType == E_TOKEN_TYPE::SPACE);

		_expect(E_TOKEN_TYPE::NEWLINE, currToken.mType);

		bool skip = std::find_if(mSymTable.cbegin(), mSymTable.cend(), [&macroIdentifier](auto&& item)
			{
				return item.mName == macroIdentifier;
			}) != mSymTable.cend();

		// \note IsParentBlockActive is used to inherit disabled state for nested blocks
		return TIfStackEntry(skip, IsParentBlockActive(mConditionalBlocksStack));
	}